

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmLocalGenerator *lg,cmGeneratedFileStream *fout)

{
  cmMakefile *pcVar1;
  cmGlobalGenerator *pcVar2;
  cmLocalGenerator *this_00;
  cmGeneratorTarget *this_01;
  cmGeneratedFileStream *fout_00;
  cmExtraKateGenerator *this_02;
  __type _Var3;
  bool bVar4;
  TargetType TVar5;
  string *psVar6;
  string *makeArgs;
  string *path;
  ostream *poVar7;
  char *pcVar8;
  long lVar9;
  pointer ppcVar10;
  pointer ppcVar11;
  string currentDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  allocator<char> local_b9;
  cmGeneratedFileStream *local_b8;
  string *local_b0;
  string *local_a8;
  cmExtraKateGenerator *local_a0;
  string local_98;
  string local_78;
  pointer local_50;
  cmLocalGenerator *local_48;
  pointer local_40;
  pointer local_38;
  
  pcVar1 = lg->Makefile;
  local_b8 = fout;
  local_a0 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&local_78);
  psVar6 = cmMakefile::GetRequiredDefinition(pcVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_KATE_MAKE_ARGUMENTS",(allocator<char> *)&local_78);
  local_b0 = psVar6;
  makeArgs = cmMakefile::GetSafeDefinition(pcVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  fout_00 = local_b8;
  poVar7 = std::operator<<((ostream *)local_b8,"\t\"build\": {\n\t\t\"directory\": \"");
  poVar7 = std::operator<<(poVar7,(string *)path);
  std::operator<<(poVar7,"\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n"
                 );
  poVar7 = std::operator<<((ostream *)fout_00,"\t\t\"build\": \"");
  psVar6 = local_b0;
  poVar7 = std::operator<<(poVar7,(string *)local_b0);
  poVar7 = std::operator<<(poVar7," -C \\\"");
  poVar7 = std::operator<<(poVar7,(string *)path);
  poVar7 = std::operator<<(poVar7,"\\\" ");
  poVar7 = std::operator<<(poVar7,(string *)makeArgs);
  poVar7 = std::operator<<(poVar7," ");
  std::operator<<(poVar7,"all\",\n");
  poVar7 = std::operator<<((ostream *)fout_00,"\t\t\"clean\": \"");
  poVar7 = std::operator<<(poVar7,(string *)psVar6);
  poVar7 = std::operator<<(poVar7," -C \\\"");
  poVar7 = std::operator<<(poVar7,(string *)path);
  poVar7 = std::operator<<(poVar7,"\\\" ");
  poVar7 = std::operator<<(poVar7,(string *)makeArgs);
  poVar7 = std::operator<<(poVar7," ");
  std::operator<<(poVar7,"clean\",\n");
  poVar7 = std::operator<<((ostream *)fout_00,"\t\t\"quick\": \"");
  poVar7 = std::operator<<(poVar7,(string *)psVar6);
  poVar7 = std::operator<<(poVar7," -C \\\"");
  poVar7 = std::operator<<(poVar7,(string *)path);
  poVar7 = std::operator<<(poVar7,"\\\" ");
  poVar7 = std::operator<<(poVar7,(string *)makeArgs);
  poVar7 = std::operator<<(poVar7," ");
  std::operator<<(poVar7,"install\",\n");
  std::operator<<((ostream *)fout_00,"\t\t\"targets\":[\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"all",(allocator<char> *)&local_78);
  this_02 = local_a0;
  local_a8 = path;
  AppendTarget(local_a0,fout_00,&local_98,psVar6,makeArgs,path,path);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"clean",(allocator<char> *)&local_78);
  AppendTarget(this_02,fout_00,&local_98,local_b0,makeArgs,local_a8,local_a8);
  std::__cxx11::string::~string((string *)&local_98);
  pcVar2 = (this_02->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  ppcVar10 = (pcVar2->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_50 = (pcVar2->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  do {
    if (ppcVar10 == local_50) {
      std::operator<<((ostream *)local_b8,"\t] }\n");
      return;
    }
    this_00 = *ppcVar10;
    local_40 = ppcVar10;
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)&local_98,(string *)psVar6);
    psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_00);
    _Var3 = std::operator==(&local_98,psVar6);
    local_38 = (this_00->GeneratorTargets).
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    local_48 = this_00;
    for (ppcVar11 = (this_00->GeneratorTargets).
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppcVar11 != local_38;
        ppcVar11 = ppcVar11 + 1) {
      this_01 = *ppcVar11;
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
      TVar5 = cmGeneratorTarget::GetType(this_01);
      if (TVar5 < UTILITY) {
        AppendTarget(local_a0,local_b8,psVar6,local_b0,makeArgs,&local_98,local_a8);
        std::__cxx11::string::string((string *)&local_78,(string *)psVar6);
        std::__cxx11::string::append((char *)&local_78);
        AppendTarget(local_a0,local_b8,&local_78,local_b0,makeArgs,&local_98,local_a8);
        std::__cxx11::string::~string((string *)&local_78);
      }
      else if (TVar5 == UTILITY) {
        lVar9 = std::__cxx11::string::find((char *)psVar6,0x49517b);
        if (lVar9 == 0) {
          bVar4 = std::operator!=(psVar6,"Nightly");
          if (bVar4) goto LAB_002dd418;
        }
        lVar9 = std::__cxx11::string::find((char *)psVar6,0x495077);
        if (lVar9 == 0) {
          bVar4 = std::operator!=(psVar6,"Continuous");
          if (bVar4) goto LAB_002dd418;
        }
        lVar9 = std::__cxx11::string::find((char *)psVar6,0x4950f6);
        if (lVar9 == 0) {
          bVar4 = std::operator!=(psVar6,"Experimental");
          if (bVar4) goto LAB_002dd418;
        }
        AppendTarget(local_a0,local_b8,psVar6,local_b0,makeArgs,&local_98,local_a8);
      }
      else if ((TVar5 == GLOBAL_TARGET) && (_Var3)) {
        bVar4 = std::operator==(psVar6,"edit_cache");
        if (bVar4) {
          pcVar1 = local_48->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"CMAKE_EDIT_COMMAND",&local_b9);
          pcVar8 = cmMakefile::GetDefinition(pcVar1,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          if (pcVar8 != (char *)0x0) {
            pcVar8 = strstr(pcVar8,"ccmake");
            if (pcVar8 == (char *)0x0) goto LAB_002dd495;
          }
        }
        else {
LAB_002dd495:
          AppendTarget(local_a0,local_b8,psVar6,local_b0,makeArgs,&local_98,local_a8);
        }
      }
LAB_002dd418:
    }
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    ppcVar10 = local_40 + 1;
  } while( true );
}

Assistant:

void cmExtraKateGenerator::WriteTargets(const cmLocalGenerator* lg,
                                        cmGeneratedFileStream& fout) const
{
  cmMakefile const* mf = lg->GetMakefile();
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& makeArgs =
    mf->GetSafeDefinition("CMAKE_KATE_MAKE_ARGUMENTS");
  std::string const& homeOutputDir = lg->GetBinaryDirectory();

  /* clang-format off */
  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << homeOutputDir << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";
  /* clang-format on */

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "install\",\n";

  // this is for kate >= 4.13:
  fout << "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", make, makeArgs, homeOutputDir,
                     homeOutputDir);
  this->AppendTarget(fout, "clean", make, makeArgs, homeOutputDir,
                     homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (cmLocalGenerator* localGen :
       this->GlobalGenerator->GetLocalGenerators()) {
    const std::vector<cmGeneratorTarget*>& targets =
      localGen->GetGeneratorTargets();
    std::string currentDir = localGen->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == localGen->GetBinaryDirectory());

    for (cmGeneratorTarget* target : targets) {
      std::string const& targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel) {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (targetName == "edit_cache") {
              const char* editCommand =
                localGen->GetMakefile()->GetDefinition("CMAKE_EDIT_COMMAND");
              if (editCommand == nullptr) {
                insertTarget = false;
              } else if (strstr(editCommand, "ccmake") != nullptr) {
                insertTarget = false;
              }
            }
          }
          if (insertTarget) {
            this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                               homeOutputDir);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly") == 0) &&
               (targetName != "Nightly")) ||
              ((targetName.find("Continuous") == 0) &&
               (targetName != "Continuous")) ||
              ((targetName.find("Experimental") == 0) &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, make, makeArgs, currentDir,
                             homeOutputDir);

        } break;
        default:
          break;
      }
    }

    // insert rules for compiling, preprocessing and assembling individual
    // files
    std::vector<std::string> objectFileTargets;
    localGen->GetIndividualFileTargets(objectFileTargets);
    for (std::string const& f : objectFileTargets) {
      this->AppendTarget(fout, f, make, makeArgs, currentDir, homeOutputDir);
    }
  }

  fout << "\t] }\n";
}